

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest_main.h
# Opt level: O2

void bssl::SetupGoogleTest(void)

{
  UnitTest *this;
  TestEventListeners *this_00;
  TestEventListener *listener;
  
  signal(0xd,(__sighandler_t)0x1);
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::listeners(this);
  listener = (TestEventListener *)operator_new(8);
  listener->_vptr_TestEventListener = (_func_int **)&PTR__TestEventListener_0068e278;
  testing::TestEventListeners::Append(this_00,listener);
  return;
}

Assistant:

inline void SetupGoogleTest() {
#if defined(OPENSSL_WINDOWS)
  // Initialize Winsock.
  WORD wsa_version = MAKEWORD(2, 2);
  WSADATA wsa_data;
  int wsa_err = WSAStartup(wsa_version, &wsa_data);
  if (wsa_err != 0) {
    fprintf(stderr, "WSAStartup failed: %d\n", wsa_err);
    exit(1);
  }
  if (wsa_data.wVersion != wsa_version) {
    fprintf(stderr, "Didn't get expected version: %x\n", wsa_data.wVersion);
    exit(1);
  }
#else
  // Some tests create pipes. We check return values, so avoid being killed by
  // |SIGPIPE|.
  signal(SIGPIPE, SIG_IGN);
#endif

  testing::UnitTest::GetInstance()->listeners().Append(new TestEventListener);
}